

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall
crypto_tests::CryptoTest::TestFSChaCha20Poly1305
          (CryptoTest *this,string *plain_hex,string *aad_hex,string *key_hex,uint64_t msg_idx,
          string *cipher_hex)

{
  long lVar1;
  Span<const_std::byte> aad_00;
  Span<const_std::byte> aad_01;
  Span<std::byte> plain1;
  Span<std::byte> plain1_00;
  Span<std::byte> cipher_00;
  Span<std::byte> cipher_01;
  Span<std::byte> plain2;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  element_type *peVar6;
  byte *pbVar7;
  uint64_t uVar8;
  size_t sVar9;
  iterator pvVar10;
  iterator pvVar11;
  string *psVar12;
  element_type *peVar13;
  long in_FS_OFFSET;
  readonly_property<bool> rVar14;
  bool bVar15;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  Span<const_std::byte> key_00;
  Span<const_std::byte> plain1_01;
  Span<const_std::byte> plain1_02;
  const_string file;
  Span<const_std::byte> key_01;
  Span<const_std::byte> cipher_02;
  Span<const_std::byte> cipher_03;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  Span<const_std::byte> plain2_00;
  Span<const_std::byte> aad_02;
  Span<const_std::byte> aad_03;
  vector<std::byte,_std::allocator<std::byte>_> decipher;
  vector<std::byte,_std::allocator<std::byte>_> cipher;
  vector<std::byte,_std::allocator<std::byte>_> expected_cipher;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<std::byte,_std::allocator<std::byte>_> aad;
  vector<std::byte,_std::allocator<std::byte>_> plain;
  FSChaCha20Poly1305 dec_aead;
  FSChaCha20Poly1305 enc_aead;
  byte dummy_tag [16];
  check_type cVar16;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  assertion_result local_2b8;
  char **local_2a0;
  _func_int **local_290;
  element_type *peStack_288;
  shared_count sStack_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  byte *local_258;
  size_t sStack_250;
  _func_int **local_248;
  element_type *peStack_240;
  vector<std::byte,_std::allocator<std::byte>_> local_238;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  _func_int **local_1f0;
  element_type *peStack_1e8;
  _func_int **local_1e0;
  check_type cStack_1d8;
  vector<std::byte,_std::allocator<std::byte>_> local_1d0;
  vector<std::byte,_std::allocator<std::byte>_> local_1b8;
  vector<std::byte,_std::allocator<std::byte>_> local_1a0;
  vector<std::byte,_std::allocator<std::byte>_> local_188;
  vector<std::byte,_std::allocator<std::byte>_> local_170;
  undefined1 local_158 [24];
  vector<std::byte,_std::allocator<std::byte>_> *local_140;
  undefined8 local_e4;
  uint64_t local_d8;
  FSChaCha20Poly1305 local_d0;
  _func_int *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (plain_hex->_M_dataplus)._M_p;
  hex_str._M_len = plain_hex->_M_string_length;
  psVar12 = cipher_hex;
  ParseHex<std::byte>(&local_170,hex_str);
  hex_str_00._M_str = (aad_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = aad_hex->_M_string_length;
  ParseHex<std::byte>(&local_188,hex_str_00);
  hex_str_01._M_str = (key_hex->_M_dataplus)._M_p;
  hex_str_01._M_len = key_hex->_M_string_length;
  ParseHex<std::byte>(&local_1a0,hex_str_01);
  hex_str_02._M_str = (cipher_hex->_M_dataplus)._M_p;
  hex_str_02._M_len = cipher_hex->_M_string_length;
  ParseHex<std::byte>(&local_1b8,hex_str_02);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&local_1d0,
             (size_type)
             (local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish +
             (0x10 - (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start)),(allocator_type *)&local_d0);
  iVar3 = 0;
  do {
    peVar13 = (element_type *)
              (local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish +
              -(long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start);
    peVar4 = peVar13;
    if (iVar3 != 0) {
      if (peVar13 == (element_type *)0x0) {
        uVar2 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (peVar13 != (element_type *)0x0) {
          for (; (ulong)peVar13 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar2 = (uint)lVar1 ^ 0x3f;
      }
      do {
        peVar4 = (element_type *)
                 RandomMixin<FastRandomContext>::randbits
                           (&(this->super_BasicTestingSetup).m_rng.
                             super_RandomMixin<FastRandomContext>,0x40 - uVar2);
      } while (peVar13 < peVar4);
    }
    local_48 = (_func_int *)0x0;
    uStack_40 = 0;
    key_00.m_size =
         (long)local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    key_00.m_data =
         local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    AEADChaCha20Poly1305::AEADChaCha20Poly1305(&local_d0.m_aead,key_00);
    local_d0.m_rekey_interval = 0xe0;
    local_d0.m_packet_counter = 0;
    local_d0.m_rekey_counter = 0;
    uVar8 = msg_idx;
    if (msg_idx != 0) {
      do {
        local_2b8.m_message.px = (element_type *)0x10;
        local_158._8_8_ = 0;
        aad_00.m_size = 0;
        aad_00.m_data = (byte *)&local_48;
        cipher_00.m_size = 0x10;
        cipher_00.m_data = (byte *)&local_48;
        plain1_01.m_size = 0;
        plain1_01.m_data = (byte *)&local_48;
        local_2b8._0_8_ = &local_48;
        local_158._0_8_ = &local_48;
        FSChaCha20Poly1305::Encrypt
                  (&local_d0,plain1_01,(Span<const_std::byte>)ZEXT816(0),aad_00,cipher_00);
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    if (iVar3 == 0) {
      peVar13 = (element_type *)
                (local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start);
      local_158._8_8_ =
           (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      peVar6 = (element_type *)
               ((long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start);
      local_2b8._0_8_ =
           local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_158._0_8_ =
           local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      pbVar7 = (byte *)0x0;
      aad_03.m_size = (pointer)0x0;
      local_2b8.m_message.px = peVar6;
      _cVar16 = (check_type)local_158._8_8_;
    }
    else {
      pbVar7 = local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start + (long)peVar4;
      aad_03.m_size =
           local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish + -(long)pbVar7;
      local_1e0 = (_func_int **)
                  local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      _cStack_1d8 = (check_type)
                    ((long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      local_1f0 = (_func_int **)
                  local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      peVar6 = (element_type *)
               ((long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start);
      peVar13 = peVar4;
      peStack_1e8 = peVar6;
      _cVar16 = _cStack_1d8;
    }
    aad_01.m_size._0_4_ = (check_type)_cVar16;
    aad_01.m_data =
         local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_01.m_size._4_4_ = (int)((ulong)_cVar16 >> 0x20);
    cipher_01.m_size = (size_t)peVar6;
    cipher_01.m_data =
         local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain1_02.m_size = (size_t)peVar13;
    plain1_02.m_data =
         local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain2_00.m_size = (size_t)aad_03.m_size;
    plain2_00.m_data = pbVar7;
    FSChaCha20Poly1305::Encrypt(&local_d0,plain1_02,plain2_00,aad_01,cipher_01);
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1f8 = "";
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x140;
    file.m_begin = (iterator)&local_200;
    msg.m_end = (iterator)psVar12;
    msg.m_begin = (iterator)aad_03.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_210,msg);
    if ((long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
      rVar14.super_class_property<bool>.value =
           (class_property<bool>)
           (local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start ==
           local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish);
      if (!(bool)rVar14.super_class_property<bool>.value) {
        pp_Var5 = (_func_int **)
                  local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pbVar7 = local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start ==
            *local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start) {
          do {
            pbVar7 = pbVar7 + 1;
            pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
            rVar14.super_class_property<bool>.value =
                 (class_property<bool>)
                 (pp_Var5 ==
                 (_func_int **)
                 local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish);
            if ((bool)rVar14.super_class_property<bool>.value) goto LAB_0036e2d5;
          } while (*(byte *)pp_Var5 == *pbVar7);
        }
        goto LAB_0036e2d3;
      }
    }
    else {
LAB_0036e2d3:
      rVar14.super_class_property<bool>.value = (class_property<bool>)false;
    }
LAB_0036e2d5:
    local_2b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar14.super_class_property<bool>.value;
    local_2b8.m_message.px = (element_type *)0x0;
    local_2b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xe7e572;
    local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xe7e58b;
    local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
    local_158._0_8_ = &PTR__lazy_ostream_013abc70;
    local_158._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_140 = &local_238;
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_218 = "";
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2b8,(lazy_ostream *)local_158,1,0,WARN,_cVar16,(size_t)&local_220,0x140);
    boost::detail::shared_count::~shared_count(&local_2b8.m_message.pn);
    key_01.m_size =
         (long)local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    key_01.m_data =
         local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    AEADChaCha20Poly1305::AEADChaCha20Poly1305((AEADChaCha20Poly1305 *)local_158,key_01);
    local_e4._0_4_ = 0xe0;
    local_e4._4_4_ = 0;
    local_d8 = 0;
    uVar8 = msg_idx;
    if (msg_idx != 0) {
      do {
        local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2b8._0_8_ = (_func_int **)0x0;
        local_2b8.m_message.px = (element_type *)0x0;
        plain1.m_size = 0;
        plain1.m_data = (byte *)&local_48;
        cipher_02.m_size = 0x10;
        cipher_02.m_data = (byte *)&local_48;
        aad_02.m_size = 0;
        aad_02.m_data = (byte *)&local_48;
        local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_48;
        FSChaCha20Poly1305::Decrypt
                  ((FSChaCha20Poly1305 *)local_158,cipher_02,aad_02,plain1,
                   (Span<std::byte>)ZEXT816(0));
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&local_238,
               (size_type)
               ((long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish +
               (-0x10 - (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start)),
               (allocator_type *)&local_2b8);
    cipher_03.m_size =
         (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (iVar3 == 0) {
      peStack_288 = (element_type *)
                    ((long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      local_290 = (_func_int **)
                  local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_2b8._0_8_ = (_func_int **)0x0;
      local_2b8.m_message.px = (element_type *)0x0;
      pbVar7 = (byte *)0x0;
      sVar9 = 0;
      peVar4 = peStack_288;
    }
    else {
      local_248 = (_func_int **)
                  local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pbVar7 = (byte *)((long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start + (long)peVar4);
      sVar9 = (long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pbVar7;
      local_258 = pbVar7;
      sStack_250 = sVar9;
      peStack_240 = peVar4;
    }
    aad_03.m_size =
         local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    plain1_00.m_size._0_4_ = (check_type)peVar4;
    plain1_00.m_data =
         local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain1_00.m_size._4_4_ = (int)((ulong)peVar4 >> 0x20);
    plain2.m_size = sVar9;
    plain2.m_data = pbVar7;
    cipher_03.m_data =
         local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_03.m_data =
         local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    rVar14.super_class_property<bool>.value =
         (class_property<bool>)
         FSChaCha20Poly1305::Decrypt
                   ((FSChaCha20Poly1305 *)local_158,cipher_03,aad_03,plain1_00,plain2);
    local_268 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_260 = "";
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x150;
    file_00.m_begin = (iterator)&local_268;
    msg_00.m_end = pvVar10;
    msg_00.m_begin = (iterator)aad_03.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
               msg_00);
    peStack_288 = (element_type *)0x0;
    sStack_280.pi_ = (sp_counted_base *)0x0;
    local_2c8 = "ret";
    local_2c0 = "";
    local_2b8.m_message.px = (element_type *)((ulong)local_2b8.m_message.px & 0xffffffffffffff00);
    local_2b8._0_8_ = &PTR__lazy_ostream_013abc70;
    local_2b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2a0 = &local_2c8;
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2d0 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    local_290._0_1_ = rVar14.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_290,(lazy_ostream *)&local_2b8,1,0,WARN,(check_type)peVar4
               ,(size_t)&local_2d8,0x150);
    boost::detail::shared_count::~shared_count(&sStack_280);
    local_2e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x151;
    file_01.m_begin = (iterator)&local_2e8;
    msg_01.m_end = pvVar11;
    msg_01.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2f8,
               msg_01);
    if ((long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
      bVar15 = local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start ==
               local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (!bVar15) {
        pp_Var5 = (_func_int **)
                  local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pbVar7 = local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start ==
            *local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start) {
          do {
            pbVar7 = pbVar7 + 1;
            pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
            bVar15 = pp_Var5 ==
                     (_func_int **)
                     local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (bVar15) goto LAB_0036e6b6;
          } while (*(byte *)pp_Var5 == *pbVar7);
        }
        bVar15 = false;
      }
    }
    else {
      bVar15 = false;
    }
LAB_0036e6b6:
    local_290 = (_func_int **)CONCAT71(local_290._1_7_,bVar15);
    peStack_288 = (element_type *)0x0;
    sStack_280.pi_ = (sp_counted_base *)0x0;
    local_2c8 = "decipher == plain";
    local_2c0 = "";
    local_2b8.m_message.px = (element_type *)((ulong)local_2b8.m_message.px & 0xffffffffffffff00);
    local_2b8._0_8_ = &PTR__lazy_ostream_013abc70;
    local_2b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2a0 = &local_2c8;
    local_308 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_300 = "";
    psVar12 = (string *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_290,(lazy_ostream *)&local_2b8,1,0,WARN,(check_type)peVar4
               ,(size_t)&local_308,0x151);
    boost::detail::shared_count::~shared_count(&sStack_280);
    if ((_func_int **)
        local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ChaCha20::~ChaCha20((ChaCha20 *)local_158);
    ChaCha20::~ChaCha20((ChaCha20 *)&local_d0);
    iVar3 = iVar3 + 1;
    if (iVar3 == 10) {
      if ((_func_int **)
          local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (_func_int **)0x0) {
        operator_delete(local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((_func_int **)
          local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (_func_int **)0x0) {
        operator_delete(local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void TestFSChaCha20Poly1305(const std::string& plain_hex, const std::string& aad_hex, const std::string& key_hex, uint64_t msg_idx, const std::string& cipher_hex)
{
    auto plain = ParseHex<std::byte>(plain_hex);
    auto aad = ParseHex<std::byte>(aad_hex);
    auto key = ParseHex<std::byte>(key_hex);
    auto expected_cipher = ParseHex<std::byte>(cipher_hex);
    std::vector<std::byte> cipher(plain.size() + FSChaCha20Poly1305::EXPANSION);

    for (int it = 0; it < 10; ++it) {
        // During it==0 we use the single-plain Encrypt/Decrypt; others use a split at prefix.
        size_t prefix = it ? m_rng.randrange(plain.size() + 1) : plain.size();
        std::byte dummy_tag[FSChaCha20Poly1305::EXPANSION] = {{}};

        // Do msg_idx dummy encryptions to seek to the correct packet.
        FSChaCha20Poly1305 enc_aead{key, 224};
        for (uint64_t i = 0; i < msg_idx; ++i) {
            enc_aead.Encrypt(Span{dummy_tag}.first(0), Span{dummy_tag}.first(0), dummy_tag);
        }

        // Invoke single-plain or plain1/plain2 Encrypt.
        if (it == 0) {
            enc_aead.Encrypt(plain, aad, cipher);
        } else {
            enc_aead.Encrypt(Span{plain}.first(prefix), Span{plain}.subspan(prefix), aad, cipher);
        }
        BOOST_CHECK(cipher == expected_cipher);

        // Do msg_idx dummy decryptions to seek to the correct packet.
        FSChaCha20Poly1305 dec_aead{key, 224};
        for (uint64_t i = 0; i < msg_idx; ++i) {
            dec_aead.Decrypt(dummy_tag, Span{dummy_tag}.first(0), Span{dummy_tag}.first(0));
        }

        // Invoke single-plain or plain1/plain2 Decrypt.
        std::vector<std::byte> decipher(cipher.size() - AEADChaCha20Poly1305::EXPANSION);
        bool ret{false};
        if (it == 0) {
            ret = dec_aead.Decrypt(cipher, aad, decipher);
        } else {
            ret = dec_aead.Decrypt(cipher, aad, Span{decipher}.first(prefix), Span{decipher}.subspan(prefix));
        }
        BOOST_CHECK(ret);
        BOOST_CHECK(decipher == plain);
    }
}